

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void fcse_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint64_t uVar1;
  CPUARMState_conflict *__mptr;
  
  uVar1 = raw_read(env,ri);
  if (uVar1 == value) {
    return;
  }
  tlb_flush_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14));
  raw_write(env,ri,value);
  return;
}

Assistant:

static void fcse_write(CPUARMState *env, const ARMCPRegInfo *ri, uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);

    if (raw_read(env, ri) != value) {
        /* Unlike real hardware the qemu TLB uses virtual addresses,
         * not modified virtual addresses, so this causes a TLB flush.
         */
        tlb_flush(CPU(cpu));
        raw_write(env, ri, value);
    }
}